

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O2

BOOL __thiscall
Js::DebugDocument::GetStatementLocation(DebugDocument *this,int32 ibos,StatementLocation *plocation)

{
  int iVar1;
  ScriptContext *pSVar2;
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar3;
  SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_> *pSVar4;
  FunctionBody *this_00;
  code *pcVar5;
  Interval other;
  Interval other_00;
  bool bVar6;
  int iVar7;
  charcount_t cVar8;
  BOOL BVar9;
  BOOL BVar10;
  undefined4 *puVar11;
  StatementLocation *pSVar12;
  uint uVar13;
  ulong uVar14;
  Interval local_70;
  StatementLocation local_68;
  Interval local_50;
  StatementLocation local_48;
  
  if (ibos < 0) {
    return 0;
  }
  pSVar2 = (this->utf8SourceInfo->m_scriptContext).ptr;
  if (pSVar2 == (ScriptContext *)0x0) {
    return 0;
  }
  iVar7 = (*(pSVar2->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
  if ((char)iVar7 != '\0') {
    return 0;
  }
  local_68.function = (FunctionBody *)0x0;
  local_68.statement.begin = 0;
  local_68.statement.end = 0;
  local_68.bytecodeSpan.begin = 0;
  local_68.bytecodeSpan.end = 0;
  local_48.function = (FunctionBody *)0x0;
  local_48.statement.begin = 0;
  local_48.statement.end = 0;
  local_48.bytecodeSpan.begin = 0;
  local_48.bytecodeSpan.end = 0;
  pSVar3 = (this->utf8SourceInfo->functionBodyDictionary).ptr;
  if (pSVar3 != (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                 *)0x0) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (uVar14 = 0;
        uVar14 < (pSVar3->
                 super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ).bucketCount; uVar14 = uVar14 + 1) {
      iVar7 = (pSVar3->
              super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ).buckets.ptr[uVar14];
      if (iVar7 != -1) {
LAB_007e179a:
        if (iVar7 != -1) {
          pSVar4 = (pSVar3->
                   super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ).entries.ptr;
          iVar1 = pSVar4[iVar7].
                  super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>.
                  super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                  .
                  super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                  .next;
          this_00 = pSVar4[iVar7].
                    super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>.
                    super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                    .
                    super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                    .value.ptr;
          if (this_00 == (FunctionBody *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                        ,0xa2,"(functionBody)","functionBody");
            if (!bVar6) goto LAB_007e1b09;
            *puVar11 = 0;
          }
          cVar8 = ParseableFunctionInfo::StartInDocument(&this_00->super_ParseableFunctionInfo);
          iVar7 = iVar1;
          if (local_68.function != (FunctionBody *)0x0) goto code_r0x007e180e;
          goto LAB_007e1855;
        }
      }
    }
  }
  if (local_68.function == (FunctionBody *)0x0 && local_48.function == (FunctionBody *)0x0) {
    return 0;
  }
  if (local_68.function == (FunctionBody *)0x0 || local_48.function == (FunctionBody *)0x0) {
    pSVar12 = &local_68;
    if (local_68.function == (FunctionBody *)0x0) {
      pSVar12 = &local_48;
    }
    plocation->bytecodeSpan = pSVar12->bytecodeSpan;
    local_48.function._0_4_ = *(undefined4 *)&pSVar12->function;
    local_48.function._4_4_ = *(undefined4 *)((long)&pSVar12->function + 4);
    local_48.statement.begin = (pSVar12->statement).begin;
    local_48.statement.end = (pSVar12->statement).end;
    goto LAB_007e1abe;
  }
  if (local_68.function == local_48.function) {
LAB_007e196b:
    if (local_48.statement.begin <= local_68.statement.begin) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                  ,0x147,
                                  "(candidateMatch1.statement.begin < candidateMatch2.statement.begin)"
                                  ,
                                  "candidateMatch1.statement.begin < candidateMatch2.statement.begin"
                                 );
      if (!bVar6) goto LAB_007e1b09;
      *puVar11 = 0;
    }
    if (ibos <= local_68.statement.begin) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                  ,0x148,"(candidateMatch1.statement.begin < ibos)",
                                  "candidateMatch1.statement.begin < ibos");
      if (!bVar6) goto LAB_007e1b09;
      *puVar11 = 0;
    }
    if (local_48.statement.begin < ibos) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                  ,0x149,"(candidateMatch2.statement.begin >= ibos)",
                                  "candidateMatch2.statement.begin >= ibos");
      if (!bVar6) {
LAB_007e1b09:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar11 = 0;
    }
    plocation->bytecodeSpan = local_68.bytecodeSpan;
    plocation->function = local_68.function;
    plocation->statement = local_68.statement;
    BVar9 = HasLineBreak(this,ibos,local_48.statement.begin);
    if (local_48.statement.begin != ibos) {
      BVar10 = HasLineBreak(this,local_68.statement.begin,ibos);
      if ((BVar9 != 0) || (BVar10 == 0)) {
        if (ibos <= local_68.statement.end) {
          return 1;
        }
        if ((BVar9 != 0) && (BVar9 = HasLineBreak(this,local_68.statement.end,ibos), BVar9 == 0)) {
          return 1;
        }
        plocation->bytecodeSpan = local_48.bytecodeSpan;
        plocation->function = local_48.function;
        plocation->statement = local_48.statement;
        return 1;
      }
    }
    plocation->bytecodeSpan = local_48.bytecodeSpan;
  }
  else {
    local_70.begin =
         ParseableFunctionInfo::StartInDocument(&(local_68.function)->super_ParseableFunctionInfo);
    local_70.end = local_70.begin + ((local_68.function)->super_ParseableFunctionInfo).m_cbLength;
    local_50.begin =
         ParseableFunctionInfo::StartInDocument(&(local_48.function)->super_ParseableFunctionInfo);
    local_50.end = local_50.begin + ((local_48.function)->super_ParseableFunctionInfo).m_cbLength;
    other_00.end = local_50.end;
    other_00.begin = local_50.begin;
    bVar6 = regex::Interval::Includes(&local_70,other_00);
    if (((bVar6) && (bVar6 = regex::Interval::Includes(&local_50,ibos), bVar6)) &&
       (local_50.end != ibos)) {
      pSVar12 = &local_48;
    }
    else {
      other.end = local_70.end;
      other.begin = local_70.begin;
      bVar6 = regex::Interval::Includes(&local_50,other);
      if (((!bVar6) || (bVar6 = regex::Interval::Includes(&local_70,ibos), !bVar6)) ||
         (local_70.end == ibos)) goto LAB_007e196b;
      pSVar12 = &local_68;
    }
    plocation->bytecodeSpan = pSVar12->bytecodeSpan;
    local_48.function._0_4_ = *(undefined4 *)&pSVar12->function;
    local_48.function._4_4_ = *(undefined4 *)((long)&pSVar12->function + 4);
    local_48.statement.begin = (pSVar12->statement).begin;
    local_48.statement.end = (pSVar12->statement).end;
  }
LAB_007e1abe:
  *(undefined4 *)&plocation->function = local_48.function._0_4_;
  *(undefined4 *)((long)&plocation->function + 4) = local_48.function._4_4_;
  (plocation->statement).begin = local_48.statement.begin;
  (plocation->statement).end = local_48.statement.end;
  return 1;
code_r0x007e180e:
  uVar13 = (this_00->super_ParseableFunctionInfo).m_cbLength + cVar8;
  if ((((cVar8 < (uint)ibos &&
         (local_68.statement.end <= (int)uVar13 || local_68.statement.begin <= (int)cVar8)) ||
       (local_48.function == (FunctionBody *)0x0)) ||
      (((uint)ibos <= cVar8 && ((int)cVar8 < local_48.statement.begin)))) ||
     ((uint)ibos < uVar13 && cVar8 <= (uint)ibos)) {
LAB_007e1855:
    FunctionBody::FindClosestStatements(this_00,ibos,&local_68,&local_48);
  }
  goto LAB_007e179a;
}

Assistant:

BOOL DebugDocument::GetStatementLocation(int32 ibos, StatementLocation* plocation)
    {
        if (ibos < 0)
        {
            return FALSE;
        }

        ScriptContext* scriptContext = this->utf8SourceInfo->GetScriptContext();
        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            return FALSE;
        }

        uint32 ubos = static_cast<uint32>(ibos);

        // Getting the appropriate statement on the asked position works on the heuristic which requires two
        // probable candidates. These candidates will be closest to the ibos where first.range.start < ibos and
        // second.range.start >= ibos. They will be fetched out by going into each FunctionBody.

        StatementLocation candidateMatch1 = {};
        StatementLocation candidateMatch2 = {};

        this->utf8SourceInfo->MapFunction([&](FunctionBody* pFuncBody)
        {
            uint32 functionStart = pFuncBody->StartInDocument();
            uint32 functionEnd = functionStart + pFuncBody->LengthInBytes();

            // For the first candidate, we should allow the current function to participate if its range
            // (instead of just start offset) is closer to the ubos compared to already found candidate1.

            if (candidateMatch1.function == nullptr ||
                ((candidateMatch1.statement.begin <= static_cast<int>(functionStart) ||
                candidateMatch1.statement.end <= static_cast<int>(functionEnd)) &&
                ubos > functionStart) ||
                candidateMatch2.function == nullptr ||
                (candidateMatch2.statement.begin > static_cast<int>(functionStart) &&
                ubos <= functionStart) ||
                (functionStart <= ubos &&
                ubos < functionEnd))
            {
                // We need to find out two possible candidate from the current FunctionBody.
                pFuncBody->FindClosestStatements(ibos, &candidateMatch1, &candidateMatch2);
            }
        });

        if (candidateMatch1.function == nullptr && candidateMatch2.function == nullptr)
        {
            return FALSE; // No Match found
        }

        if (candidateMatch1.function == nullptr || candidateMatch2.function == nullptr)
        {
            *plocation = (candidateMatch1.function == nullptr) ? candidateMatch2 : candidateMatch1;

            return TRUE;
        }

        // If one of the func is inner to another one, and ibos is in the inner one, disregard the outer one/let the inner one win.
        // See WinBlue 575634. Scenario is like this: var foo = function () {this;} -- and BP is set to 'this;' 'function'.
        if (candidateMatch1.function != candidateMatch2.function)
        {
            Assert(candidateMatch1.function && candidateMatch2.function);

            regex::Interval func1Range(candidateMatch1.function->StartInDocument());
            func1Range.End(func1Range.Begin() + candidateMatch1.function->LengthInBytes());
            regex::Interval func2Range(candidateMatch2.function->StartInDocument());
            func2Range.End(func2Range.Begin() + candidateMatch2.function->LengthInBytes());

            // If cursor (ibos) is just after the closing braces of the inner function then we can't
            // directly choose inner function and have to make line break check, so fallback
            // function foo(){function bar(){var y=1;}#var x=1;bar();}foo(); - ibos is #
            if (func1Range.Includes(func2Range) && func2Range.Includes(ibos) && func2Range.End() != ibos)
            {
                *plocation = candidateMatch2;
                return TRUE;
            }
            else if (func2Range.Includes(func1Range) && func1Range.Includes(ibos) && func1Range.End() != ibos)
            {
                *plocation = candidateMatch1;
                return TRUE;
            }
        }

        // At this point we have both candidate to consider.

        Assert(candidateMatch1.statement.begin < candidateMatch2.statement.begin);
        Assert(candidateMatch1.statement.begin < ibos);
        Assert(candidateMatch2.statement.begin >= ibos);

        // Default selection
        *plocation = candidateMatch1;

        // If the second candidate start at ibos or
        // if the first candidate has line break between ibos and the second candidate is on the same line as ibos
        // then consider the second one.

        BOOL fNextHasLineBreak = this->HasLineBreak(ibos, candidateMatch2.statement.begin);

        if ((candidateMatch2.statement.begin == ibos)
            || (this->HasLineBreak(candidateMatch1.statement.begin, ibos) && !fNextHasLineBreak))
        {
            *plocation = candidateMatch2;
        }
        // If ibos is out of the range of first candidate, choose second candidate if  ibos is on the same line as second candidate
        // or ibos is not on the same line of the end of the first candidate.
        else if (candidateMatch1.statement.end < ibos && (!fNextHasLineBreak || this->HasLineBreak(candidateMatch1.statement.end, ibos)))
        {
            *plocation = candidateMatch2;
        }

        return TRUE;
    }